

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O2

int glfwExtensionSupported(char *extension)

{
  int iVar1;
  GLFWbool GVar2;
  undefined8 in_RAX;
  void *pvVar3;
  char *pcVar4;
  int iVar5;
  undefined8 uStack_28;
  GLint count;
  
  if (extension == (char *)0x0) {
    __assert_fail("extension != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/abel0b[P]shadow/external/glfw/src/context.c"
                  ,0x2a8,"int glfwExtensionSupported(const char *)");
  }
  if (_glfw.initialized == 0) {
    iVar5 = 0x10001;
    pcVar4 = (char *)0x0;
  }
  else {
    uStack_28 = in_RAX;
    pvVar3 = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (pvVar3 == (void *)0x0) {
      pcVar4 = "Cannot query extension without a current OpenGL or OpenGL ES context";
      iVar5 = 0x10002;
    }
    else {
      if (*extension != '\0') {
        if (*(int *)((long)pvVar3 + 0x200) < 3) {
          pcVar4 = (char *)(**(code **)((long)pvVar3 + 0x238))(0x1f03);
          if (pcVar4 == (char *)0x0) {
LAB_001b60d9:
            pcVar4 = "Extension string retrieval is broken";
            iVar5 = 0x10008;
            goto LAB_001b60e8;
          }
          GVar2 = _glfwStringInExtensionString(extension,pcVar4);
          if (GVar2 != 0) {
            return 1;
          }
        }
        else {
          (**(code **)((long)pvVar3 + 0x230))(0x821d,&count);
          iVar5 = 0;
          while (iVar5 < count) {
            pcVar4 = (char *)(**(code **)((long)pvVar3 + 0x228))(0x1f03,iVar5);
            if (pcVar4 == (char *)0x0) goto LAB_001b60d9;
            iVar1 = strcmp(pcVar4,extension);
            iVar5 = iVar5 + 1;
            if (iVar1 == 0) {
              return 1;
            }
          }
        }
        iVar5 = (**(code **)((long)pvVar3 + 600))(extension);
        return iVar5;
      }
      pcVar4 = "Extension name cannot be an empty string";
      iVar5 = 0x10004;
    }
  }
LAB_001b60e8:
  _glfwInputError(iVar5,pcVar4);
  return 0;
}

Assistant:

GLFWAPI int glfwExtensionSupported(const char* extension)
{
    _GLFWwindow* window;
    assert(extension != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(GLFW_FALSE);

    window = _glfwPlatformGetTls(&_glfw.contextSlot);
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT,
                        "Cannot query extension without a current OpenGL or OpenGL ES context");
        return GLFW_FALSE;
    }

    if (*extension == '\0')
    {
        _glfwInputError(GLFW_INVALID_VALUE, "Extension name cannot be an empty string");
        return GLFW_FALSE;
    }

    if (window->context.major >= 3)
    {
        int i;
        GLint count;

        // Check if extension is in the modern OpenGL extensions string list

        window->context.GetIntegerv(GL_NUM_EXTENSIONS, &count);

        for (i = 0;  i < count;  i++)
        {
            const char* en = (const char*)
                window->context.GetStringi(GL_EXTENSIONS, i);
            if (!en)
            {
                _glfwInputError(GLFW_PLATFORM_ERROR,
                                "Extension string retrieval is broken");
                return GLFW_FALSE;
            }

            if (strcmp(en, extension) == 0)
                return GLFW_TRUE;
        }
    }
    else
    {
        // Check if extension is in the old style OpenGL extensions string

        const char* extensions = (const char*)
            window->context.GetString(GL_EXTENSIONS);
        if (!extensions)
        {
            _glfwInputError(GLFW_PLATFORM_ERROR,
                            "Extension string retrieval is broken");
            return GLFW_FALSE;
        }

        if (_glfwStringInExtensionString(extension, extensions))
            return GLFW_TRUE;
    }

    // Check if extension is in the platform-specific string
    return window->context.extensionSupported(extension);
}